

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O1

int fits_rcomp(int *a,int nx,uchar *c,int clen,int nblock)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Buffer *buffer;
  void *__ptr;
  uint uVar6;
  uint uVar7;
  uchar *__s;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  Buffer_t *pBVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Buffer bufmem;
  Buffer local_a8;
  void *local_88;
  uint local_80;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  size_t local_58;
  ulong local_50;
  long local_48;
  int *local_40;
  ulong local_38;
  
  uVar9 = (ulong)(uint)nblock;
  local_a8.end = c + clen;
  local_a8.bits_to_go = 8;
  local_58 = (long)nblock * 4;
  local_a8.start = c;
  local_a8.current = c;
  local_88 = malloc(local_58);
  if (local_88 == (void *)0x0) {
    ffpmsg("fits_rcomp: insufficient memory");
LAB_001b4560:
    local_a8.current._0_4_ = -1;
  }
  else {
    local_a8.bitbuffer = 0;
    local_a8.bits_to_go = 8;
    output_nbits(&local_a8,*a,0x20);
    if (0 < nx) {
      iVar11 = *a;
      lVar5 = 0;
      local_68 = (ulong)(uint)nx;
      local_60 = (long)nblock;
      do {
        __ptr = local_88;
        uVar12 = local_68 - lVar5;
        if (local_60 <= (long)(local_68 - lVar5)) {
          uVar12 = uVar9;
        }
        uVar9 = uVar12 & 0xffffffff;
        iVar3 = (int)uVar12;
        if (iVar3 < 1) {
          dVar14 = 0.0;
        }
        else {
          dVar14 = 0.0;
          uVar2 = 0;
          iVar4 = iVar11;
          do {
            iVar11 = a[uVar2];
            uVar6 = iVar11 - iVar4 >> 0x1f ^ (iVar11 - iVar4) * 2;
            *(uint *)((long)local_88 + uVar2 * 4) = uVar6;
            dVar14 = dVar14 + (double)uVar6;
            uVar2 = uVar2 + 1;
            iVar4 = iVar11;
          } while ((uVar12 & 0xffffffff) != uVar2);
        }
        dVar16 = ((dVar14 - (double)((int)(((uint)(uVar12 >> 0x1f) & 1) + iVar3) >> 1)) + -1.0) /
                 (double)iVar3;
        dVar15 = 0.0;
        if (0.0 <= dVar16) {
          dVar15 = dVar16;
        }
        uVar6 = 0x1f;
        uVar8 = (uint)(long)dVar15;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        if (uVar8 < 2) {
          uVar6 = 0;
        }
        local_48 = lVar5;
        local_40 = a;
        if (uVar6 < 0x19) {
          if (((uVar6 != 0) || (dVar14 != 0.0)) || (NAN(dVar14))) {
            local_78 = (ulong)uVar6;
            output_nbits(&local_a8,uVar6 + 1,5);
            pBVar13 = local_a8.current;
            uVar6 = local_a8.bitbuffer;
            iVar4 = local_a8.bits_to_go;
            local_70 = uVar9;
            if (0 < iVar3) {
              uVar8 = ~(-1 << ((byte)local_78 & 0x1f));
              uVar12 = uVar12 & 0xffffffff;
              uVar2 = 0;
              uVar9 = local_78;
              local_80 = uVar8;
              local_50 = uVar12;
              do {
                uVar7 = *(uint *)((long)__ptr + uVar2 * 4);
                iVar10 = (int)uVar7 >> ((byte)uVar9 & 0x1f);
                iVar3 = iVar10 - iVar4;
                if (iVar10 < iVar4) {
                  uVar6 = uVar6 << ((byte)(iVar10 + 1) & 0x1f) | 1;
                  iVar3 = iVar4 - (iVar10 + 1);
                }
                else {
                  __s = pBVar13 + 1;
                  *pBVar13 = (uchar)(uVar6 << ((byte)iVar4 & 0x1f));
                  if (7 < iVar3) {
                    if (0xe < iVar3) {
                      iVar3 = 0xf;
                    }
                    uVar8 = (iVar10 - (iVar3 + iVar4)) + 7;
                    uVar6 = uVar8 >> 3;
                    local_38 = (ulong)uVar6;
                    local_7c = uVar7;
                    memset(__s,0,(ulong)(uVar6 + 1));
                    __s = pBVar13 + local_38 + 2;
                    iVar3 = (iVar10 + -8) - ((uVar8 & 0xfffffff8) + iVar4);
                    __ptr = local_88;
                    uVar9 = local_78;
                    uVar12 = local_50;
                    uVar8 = local_80;
                    uVar7 = local_7c;
                  }
                  iVar3 = 7 - iVar3;
                  uVar6 = 1;
                  pBVar13 = __s;
                }
                iVar10 = (int)uVar9;
                iVar4 = iVar3;
                if (iVar10 != 0) {
                  uVar6 = uVar7 & uVar8 | uVar6 << ((byte)uVar9 & 0x1f);
                  iVar4 = iVar3 - iVar10;
                  if (iVar4 == 0 || iVar3 < iVar10) {
                    iVar10 = iVar10 - iVar3;
                    iVar3 = iVar4;
                    do {
                      *pBVar13 = (uchar)((int)uVar6 >> ((byte)iVar10 & 0x1f));
                      pBVar13 = pBVar13 + 1;
                      iVar4 = iVar3 + 8;
                      iVar10 = iVar10 + -8;
                      bVar1 = iVar3 < -7;
                      iVar3 = iVar4;
                    } while (bVar1);
                  }
                }
                uVar2 = uVar2 + 1;
              } while (uVar2 != uVar12);
            }
            local_a8.current = pBVar13;
            if (local_a8.end < pBVar13) {
              ffpmsg("rice_encode: end of buffer");
              free(__ptr);
              goto LAB_001b4560;
            }
            local_a8.bits_to_go = iVar4;
            local_a8.bitbuffer = uVar6;
            uVar9 = local_70;
          }
          else {
            output_nbits(&local_a8,0,5);
          }
        }
        else {
          output_nbits(&local_a8,0x1a,5);
          if (0 < iVar3) {
            uVar12 = 0;
            do {
              output_nbits(&local_a8,*(int *)((long)__ptr + uVar12 * 4),0x20);
              uVar12 = uVar12 + 1;
            } while (uVar9 != uVar12);
          }
        }
        lVar5 = local_48 + local_60;
        a = (int *)((long)local_40 + local_58);
      } while (lVar5 < (long)local_68);
    }
    if (local_a8.bits_to_go < 8) {
      *local_a8.current = (uchar)(local_a8.bitbuffer << ((byte)local_a8.bits_to_go & 0x1f));
      local_a8.current = local_a8.current + 1;
    }
    free(local_88);
    local_a8.current._0_4_ = (int)local_a8.current - (int)local_a8.start;
  }
  return (int)local_a8.current;
}

Assistant:

int fits_rcomp(int a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize;  */
int i, j, thisblock;
int lastpix, nextpix, pdiff;
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
unsigned int psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 4;   */

/*    nblock = 32; now an input parameter*/
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 5;
    fsmax = 25;

    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first int value to the first 4 bytes of the buffer */
    if (output_nbits(buffer, a[0], 32) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}

	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
	psum = ((unsigned int) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);

		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }

	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}